

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

gc_heap_ptr<mjs::regexp_object> __thiscall
mjs::anon_unknown_35::to_regexp_object
          (anon_unknown_35 *this,gc_heap_ptr<mjs::global_object> *global,value *regexp)

{
  bool bVar1;
  gc_heap_ptr_untyped *this_00;
  void *pvVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  gc_heap_ptr<mjs::regexp_object> gVar4;
  gc_heap_ptr_untyped local_40;
  wstring_view local_30;
  
  if (regexp->type_ == object) {
    this_00 = &value::object_value(regexp)->super_gc_heap_ptr_untyped;
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::regexp_object>(this_00);
    if (bVar1) {
      gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this,this_00);
      uVar3 = extraout_RDX;
      goto LAB_0014c1cc;
    }
  }
  pvVar2 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  to_string((mjs *)&local_40,*(gc_heap **)((long)pvVar2 + 8),regexp);
  local_30 = string::view((string *)&local_40);
  regexp_object::make((gc_heap_ptr<mjs::global_object> *)this,(wstring_view *)global,
                      (regexp_flag)&local_30);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
  uVar3 = extraout_RDX_00;
LAB_0014c1cc:
  gVar4.super_gc_heap_ptr_untyped._8_8_ = uVar3;
  gVar4.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (gc_heap_ptr<mjs::regexp_object>)gVar4.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<regexp_object> to_regexp_object(const gc_heap_ptr<global_object>& global, const value& regexp) {
    if (regexp.type() == value_type::object) {
        const auto& o = regexp.object_value();
        if (o.has_type<regexp_object>()) {
            return gc_heap_ptr<regexp_object>{o};
        }
    }
    auto& h = global->heap();
    return regexp_object::make(global, to_string(h, regexp).view(), regexp_flag::none);
}